

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O3

void __thiscall
cmExtraSublimeTextGenerator::CreateNewProjectFile
          (cmExtraSublimeTextGenerator *this,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs,string *filename)

{
  cmMakefile *mf;
  int iVar1;
  cmSystemTools *pcVar2;
  char *pcVar3;
  ostream *poVar4;
  char *pcVar5;
  long lVar6;
  pointer pbVar7;
  string varValue;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  string systemName;
  MapSourceFileFlags sourceFileFlags;
  string varName;
  cmGeneratedFileStream fout;
  string local_4a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_488;
  cmMakefile *local_468;
  string local_460;
  long *local_440;
  long local_438;
  long local_430 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_420;
  string local_3f0 [3];
  ios_base local_380 [264];
  undefined1 local_278 [584];
  
  mf = (*(lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
         super__Vector_impl_data._M_start)->Makefile;
  pcVar5 = (char *)0x0;
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_278,(filename->_M_dataplus)._M_p,false,None);
  if (((byte)(*(_func_int **)(local_278._0_8_ + -0x18))[(long)(local_278 + 0x20)] & 5) != 0)
  goto LAB_003812a8;
  pcVar2 = (cmSystemTools *)
           cmLocalGenerator::GetBinaryDirectory
                     (*(lgs->
                       super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
                       _M_impl.super__Vector_impl_data._M_start);
  pcVar3 = cmLocalGenerator::GetSourceDirectory
                     (*(lgs->
                       super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
                       _M_impl.super__Vector_impl_data._M_start);
  cmSystemTools::RelativePath_abi_cxx11_(&local_460,pcVar2,pcVar3,pcVar5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,"\t\"folders\":\n\t[\n\t",0x10);
  if (local_460._M_string_length == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,"\t{\n\t\t\t\"path\": \"./\"",0x12);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,"\t{\n\t\t\t\"path\": \"",0xf);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_278,local_460._M_dataplus._M_p,local_460._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"",1);
    pcVar2 = (cmSystemTools *)
             cmLocalGenerator::GetSourceDirectory
                       (*(lgs->
                         super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                         )._M_impl.super__Vector_impl_data._M_start);
    pcVar3 = cmLocalGenerator::GetBinaryDirectory
                       (*(lgs->
                         super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                         )._M_impl.super__Vector_impl_data._M_start);
    cmSystemTools::RelativePath_abi_cxx11_(local_3f0,pcVar2,pcVar3,pcVar5);
    if (local_3f0[0]._M_string_length != 0) {
      if (2 < local_3f0[0]._M_string_length) {
        std::__cxx11::string::substr((ulong)&local_420,(ulong)local_3f0);
        iVar1 = std::__cxx11::string::compare((char *)&local_420);
        if ((_Base_ptr *)local_420._M_impl._0_8_ !=
            &local_420._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)local_420._M_impl._0_8_,
                          (ulong)((long)&(local_420._M_impl.super__Rb_tree_header._M_header.
                                         _M_parent)->_M_color + 1));
        }
        if (iVar1 == 0) goto LAB_00380e36;
      }
      if (this->ExcludeBuildFolder == true) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_278,",\n\t\t\t\"folder_exclude_patterns\": [\"",0x22);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_278,local_3f0[0]._M_dataplus._M_p,
                            local_3f0[0]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"]",2);
      }
    }
LAB_00380e36:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0[0]._M_dataplus._M_p != &local_3f0[0].field_2) {
      operator_delete(local_3f0[0]._M_dataplus._M_p,local_3f0[0].field_2._M_allocated_capacity + 1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"\n\t\t}",4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"\n\t]",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,",\n\t\"build_systems\":\n\t[\n\t",0x18);
  local_420._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)((long)&local_420 + 8);
  local_420._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_420._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_420._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_420._M_impl.super__Rb_tree_header._M_header._M_right =
       local_420._M_impl.super__Rb_tree_header._M_header._M_left;
  AppendAllTargets(this,lgs,mf,(cmGeneratedFileStream *)local_278,(MapSourceFileFlags *)&local_420);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"\n\t]",3);
  local_3f0[0]._M_dataplus._M_p = (pointer)&local_3f0[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3f0,"CMAKE_SYSTEM_NAME","");
  pcVar5 = cmMakefile::GetSafeDefinition(mf,local_3f0);
  std::__cxx11::string::string((string *)&local_440,pcVar5,(allocator *)&local_4a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0[0]._M_dataplus._M_p != &local_3f0[0].field_2) {
    operator_delete(local_3f0[0]._M_dataplus._M_p,local_3f0[0].field_2._M_allocated_capacity + 1);
  }
  local_488.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_488.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_488.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmSystemTools::ExpandListArgument(&this->EnvSettings,&local_488,false);
  if ((this->EnvSettings)._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,",",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"\n\t\"env\":",8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"\n\t{",3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"\n\t\t",3);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_278,(char *)local_440,local_438);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"\n\t\t{",4);
    local_468 = mf;
    if (local_488.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_488.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar7 = local_488.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        lVar6 = std::__cxx11::string::find((char)pbVar7,0x3d);
        if (lVar6 == -1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3f0,
                     "Could not parse Env Vars specified in \"CMAKE_SUBLIME_TEXT_2_ENV_SETTINGS\"",
                     0x49);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3f0,", corrupted string ",0x13);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3f0,(pbVar7->_M_dataplus)._M_p,pbVar7->_M_string_length);
          std::__cxx11::stringbuf::str();
          cmMakefile::IssueMessage(local_468,FATAL_ERROR,&local_4a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
            operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3f0);
          std::ios_base::~ios_base(local_380);
        }
        else {
          std::__cxx11::string::substr((ulong)local_3f0,(ulong)pbVar7);
          std::__cxx11::string::substr((ulong)&local_4a8,(ulong)pbVar7);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"\n\t\t\t\"",5);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_278,local_3f0[0]._M_dataplus._M_p,
                              local_3f0[0]._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\":\"",3);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar4,local_4a8._M_dataplus._M_p,local_4a8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
            operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3f0[0]._M_dataplus._M_p != &local_3f0[0].field_2) {
            operator_delete(local_3f0[0]._M_dataplus._M_p,
                            local_3f0[0].field_2._M_allocated_capacity + 1);
          }
        }
        pbVar7 = pbVar7 + 1;
      } while (pbVar7 != local_488.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"\n\t\t}",4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"\n\t}",3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"\n}",2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_488);
  if (local_440 != local_430) {
    operator_delete(local_440,local_430[0] + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree(&local_420);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460._M_dataplus._M_p != &local_460.field_2) {
    operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
  }
LAB_003812a8:
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
  return;
}

Assistant:

void cmExtraSublimeTextGenerator::CreateNewProjectFile(
  const std::vector<cmLocalGenerator*>& lgs, const std::string& filename)
{
  const cmMakefile* mf = lgs[0]->GetMakefile();

  cmGeneratedFileStream fout(filename.c_str());
  if (!fout) {
    return;
  }

  const std::string& sourceRootRelativeToOutput = cmSystemTools::RelativePath(
    lgs[0]->GetBinaryDirectory(), lgs[0]->GetSourceDirectory());
  // Write the folder entries to the project file
  fout << "{\n";
  fout << "\t\"folders\":\n\t[\n\t";
  if (!sourceRootRelativeToOutput.empty()) {
    fout << "\t{\n\t\t\t\"path\": \"" << sourceRootRelativeToOutput << "\"";
    const std::string& outputRelativeToSourceRoot =
      cmSystemTools::RelativePath(lgs[0]->GetSourceDirectory(),
                                  lgs[0]->GetBinaryDirectory());
    if ((!outputRelativeToSourceRoot.empty()) &&
        ((outputRelativeToSourceRoot.length() < 3) ||
         (outputRelativeToSourceRoot.substr(0, 3) != "../"))) {
      if (this->ExcludeBuildFolder) {
        fout << ",\n\t\t\t\"folder_exclude_patterns\": [\""
             << outputRelativeToSourceRoot << "\"]";
      }
    }
  } else {
    fout << "\t{\n\t\t\t\"path\": \"./\"";
  }
  fout << "\n\t\t}";
  // End of the folders section
  fout << "\n\t]";

  // Write the beginning of the build systems section to the project file
  fout << ",\n\t\"build_systems\":\n\t[\n\t";

  // Set of include directories over all targets (sublime text/sublimeclang
  // doesn't currently support these settings per build system, only project
  // wide
  MapSourceFileFlags sourceFileFlags;
  AppendAllTargets(lgs, mf, fout, sourceFileFlags);

  // End of build_systems
  fout << "\n\t]";
  std::string systemName = mf->GetSafeDefinition("CMAKE_SYSTEM_NAME");
  std::vector<std::string> tokens;
  cmSystemTools::ExpandListArgument(this->EnvSettings, tokens);

  if (!this->EnvSettings.empty()) {
    fout << ",";
    fout << "\n\t\"env\":";
    fout << "\n\t{";
    fout << "\n\t\t" << systemName << ":";
    fout << "\n\t\t{";
    for (std::vector<std::string>::iterator i = tokens.begin();
         i != tokens.end(); ++i) {
      size_t const pos = i->find_first_of('=');

      if (pos != std::string::npos) {
        std::string varName = i->substr(0, pos);
        std::string varValue = i->substr(pos + 1);

        fout << "\n\t\t\t\"" << varName << "\":\"" << varValue << "\"";
      } else {
        std::ostringstream e;
        e << "Could not parse Env Vars specified in "
             "\"CMAKE_SUBLIME_TEXT_2_ENV_SETTINGS\""
          << ", corrupted string " << *i;
        mf->IssueMessage(cmake::FATAL_ERROR, e.str());
      }
    }
    fout << "\n\t\t}";
    fout << "\n\t}";
  }
  fout << "\n}";
}